

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall
VarianceEstimator_VsClosedForm_Test::TestBody(VarianceEstimator_VsClosedForm_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  undefined1 *puVar7;
  uint uVar8;
  char *pcVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 in_XMM10_Da;
  undefined4 in_XMM10_Db;
  undefined8 in_XMM10_Qb;
  AssertionResult gtest_ar;
  Float err;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  float local_24;
  double local_20;
  double local_18;
  double local_10;
  
  local_10 = 0.0;
  local_18 = 0.0;
  auVar10 = ZEXT816(0) << 0x40;
  lVar6 = 0;
  puVar7 = &DAT_5851f42d4c957f2e;
  do {
    iVar5 = (int)lVar6;
    lVar6 = lVar6 + 1;
    uVar8 = (uint)((ulong)puVar7 >> 0x2d) ^ (uint)((ulong)puVar7 >> 0x1b);
    bVar4 = (byte)((ulong)puVar7 >> 0x3b);
    auVar1._4_4_ = in_XMM10_Db;
    auVar1._0_4_ = in_XMM10_Da;
    auVar1._8_8_ = in_XMM10_Qb;
    auVar1 = vcvtusi2ss_avx512f(auVar1,uVar8 >> bVar4 | uVar8 << 0x20 - bVar4);
    puVar7 = (undefined1 *)((long)puVar7 * 0x5851f42d4c957f2d + 1);
    auVar1 = vminss_avx(ZEXT416((uint)(auVar1._0_4_ * 2.3283064e-10)),SUB6416(ZEXT464(0x3f7fffff),0)
                       );
    fVar14 = (auVar1._0_4_ + (float)iVar5) / 10000.0;
    dVar15 = (double)(fVar14 - (1.0 - fVar14));
    dVar11 = dVar15 - local_18;
    local_10 = local_10 + dVar15;
    local_18 = local_18 + dVar11 / (double)lVar6;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar11;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar15 - local_18;
    auVar10 = vfmadd231sd_fma(auVar10,auVar16,auVar17);
  } while (lVar6 != 10000);
  local_20 = auVar10._0_8_ / 9999.0;
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3f50624dd2f1a9fc;
  auVar12._0_4_ = (float)(local_20 + -0.3333333333333333);
  auVar12._4_4_ = (int)((ulong)(local_20 + -0.3333333333333333) >> 0x20);
  auVar12._8_8_ = 0;
  auVar10._8_4_ = 0x7fffffff;
  auVar10._0_8_ = 0x7fffffff7fffffff;
  auVar10._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx512vl(auVar12,auVar10);
  local_24 = auVar10._0_4_;
  testing::internal::CmpHelperLT<float,double>(local_38,"err","1e-3",&local_24,(double *)&local_48);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    std::ostream::_M_insert<double>(local_20);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x3a8,pcVar9);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3ee4f8b588e368f1;
  dVar11 = (local_10 / 10000.0 - local_18) / (local_10 / 10000.0);
  auVar13._0_4_ = (float)dVar11;
  auVar13._4_4_ = (int)((ulong)dVar11 >> 0x20);
  auVar13._8_8_ = 0;
  auVar2._8_4_ = 0x7fffffff;
  auVar2._0_8_ = 0x7fffffff7fffffff;
  auVar2._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx512vl(auVar13,auVar2);
  local_24 = auVar10._0_4_;
  testing::internal::CmpHelperLT<float,double>(local_38,"err","1e-5",&local_24,(double *)&local_48);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x3ab,pcVar9);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(VarianceEstimator, VsClosedForm) {
    VarianceEstimator<double> ve;
    int count = 10000;
    double sum = 0;
    for (Float u : Stratified1D(count)) {
        Float v = Lerp(u, -1, 1);
        ve.Add(v);
        sum += v;
    }

    // f(x) = 0, random variables x_i uniform in [-1,1] ->
    // variance is E[x^2] on [-1,1] == 1/3
    Float err = std::abs(ve.Variance() - 1. / 3.);
    EXPECT_LT(err, 1e-3) << ve.Variance();

    err = std::abs((sum / count - ve.Mean()) / (sum / count));
    EXPECT_LT(err, 1e-5);
}